

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  stbi_uc *psVar1;
  ushort uVar2;
  byte *pbVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  stbi__uint16 sVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  stbi_uc *psVar35;
  char *pcVar36;
  stbi__uint16 *data;
  stbi_uc *psVar37;
  ulong uVar38;
  stbi_uc *psVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  long lVar43;
  ulong uVar44;
  byte bVar45;
  stbi_uc sVar46;
  uint y_00;
  stbi__uint16 *psVar47;
  stbi__uint16 *psVar48;
  uint x_00;
  byte *pbVar49;
  stbi__uint16 *psVar50;
  uint uVar51;
  uint uVar52;
  long in_FS_OFFSET;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  int iVar123;
  float fVar124;
  int iVar132;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar133;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  stbi__uint16 *local_68;
  
  iVar27 = stbi__get16be(s);
  uVar28 = stbi__get16be(s);
  if ((uVar28 | iVar27 << 0x10) != 0x38425053) {
    pcVar36 = "not PSD";
    goto LAB_00146b59;
  }
  iVar27 = stbi__get16be(s);
  if (iVar27 != 1) {
    pcVar36 = "wrong version";
    goto LAB_00146b59;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar35 = s->img_buffer;
LAB_00146a42:
    s->img_buffer = psVar35 + 6;
  }
  else {
    psVar35 = s->img_buffer;
    iVar27 = (int)s->img_buffer_end - (int)psVar35;
    if (5 < iVar27) goto LAB_00146a42;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar27);
  }
  uVar28 = stbi__get16be(s);
  if (uVar28 < 0x11) {
    iVar27 = stbi__get16be(s);
    uVar29 = stbi__get16be(s);
    iVar30 = stbi__get16be(s);
    uVar31 = stbi__get16be(s);
    iVar32 = stbi__get16be(s);
    if ((iVar32 == 8) || (iVar32 == 0x10)) {
      iVar33 = stbi__get16be(s);
      if (iVar33 == 3) {
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        iVar33 = stbi__get16be(s);
        uVar34 = stbi__get16be(s);
        stbi__skip(s,iVar33 << 0x10 | uVar34);
        uVar34 = stbi__get16be(s);
        if (uVar34 < 2) {
          uVar40 = iVar27 * 0x10000;
          y_00 = uVar40 + uVar29;
          uVar41 = iVar30 * 0x10000;
          x_00 = uVar41 + uVar31;
          iVar27 = stbi__mad3sizes_valid(4,x_00,y_00,0);
          if (iVar27 == 0) {
            pcVar36 = "too large";
          }
          else {
            if (((bpc == 0x10) && (iVar32 == 0x10)) && (uVar34 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar42 = x_00 * y_00;
              if (uVar34 == 0) {
                psVar35 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                lVar43 = (ulong)((uVar29 | uVar40) * (uVar31 | uVar41)) - 1;
                auVar59._8_4_ = (int)lVar43;
                auVar59._0_8_ = lVar43;
                auVar59._12_4_ = (int)((ulong)lVar43 >> 0x20);
                psVar47 = data + 0x1e;
                uVar34 = (uVar29 + uVar40) * (uVar31 + uVar41);
                psVar50 = data + 0x1c;
                uVar38 = 0;
                psVar48 = data;
                auVar143 = _DAT_00153050;
                local_68 = data;
                do {
                  if (uVar38 < uVar28) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar42) {
                        lVar43 = 0;
                        do {
                          iVar27 = stbi__get16be(s);
                          auVar143 = _DAT_00153050;
                          local_68[lVar43 * 4] = (stbi__uint16)iVar27;
                          lVar43 = lVar43 + 1;
                        } while (uVar34 != (uint)lVar43);
                      }
                    }
                    else if (iVar32 == 0x10) {
                      if (0 < (int)uVar42) {
                        lVar43 = 0;
                        do {
                          iVar27 = stbi__get16be(s);
                          auVar143 = _DAT_00153050;
                          *(char *)(psVar48 + lVar43 * 2) = (char)((uint)iVar27 >> 8);
                          lVar43 = lVar43 + 1;
                        } while (uVar34 != (uint)lVar43);
                      }
                    }
                    else if (0 < (int)uVar42) {
                      psVar37 = s->img_buffer;
                      psVar39 = s->img_buffer_end;
                      lVar43 = 0;
                      do {
                        if (psVar37 < psVar39) {
                          s->img_buffer = psVar37 + 1;
                          sVar46 = *psVar37;
                          psVar37 = psVar37 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          sVar46 = '\0';
                        }
                        else {
                          iVar27 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                          if (iVar27 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            sVar46 = '\0';
                            psVar39 = psVar1;
                          }
                          else {
                            sVar46 = *psVar35;
                            psVar39 = psVar35 + iVar27;
                          }
                          auVar143 = _DAT_00153050;
                          s->img_buffer_end = psVar39;
                          s->img_buffer = psVar1;
                          psVar37 = psVar1;
                        }
                        *(stbi_uc *)(psVar48 + lVar43 * 2) = sVar46;
                        lVar43 = lVar43 + 1;
                      } while (uVar34 != (uint)lVar43);
                    }
                  }
                  else if (iVar32 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar42) {
                      sVar26 = -(ushort)(uVar38 == 3);
                      uVar44 = 0;
                      do {
                        auVar56._8_4_ = (int)uVar44;
                        auVar56._0_8_ = uVar44;
                        auVar56._12_4_ = (int)(uVar44 >> 0x20);
                        auVar63 = auVar59 ^ auVar143;
                        auVar144 = (auVar56 | _DAT_001565b0) ^ auVar143;
                        iVar27 = auVar63._0_4_;
                        iVar132 = -(uint)(iVar27 < auVar144._0_4_);
                        iVar30 = auVar63._4_4_;
                        auVar82._4_4_ = -(uint)(iVar30 < auVar144._4_4_);
                        iVar33 = auVar63._8_4_;
                        iVar133 = -(uint)(iVar33 < auVar144._8_4_);
                        iVar123 = auVar63._12_4_;
                        auVar82._12_4_ = -(uint)(iVar123 < auVar144._12_4_);
                        auVar111._4_4_ = iVar132;
                        auVar111._0_4_ = iVar132;
                        auVar111._8_4_ = iVar133;
                        auVar111._12_4_ = iVar133;
                        auVar63 = pshuflw(in_XMM5,auVar111,0xe8);
                        auVar81._4_4_ = -(uint)(auVar144._4_4_ == iVar30);
                        auVar81._12_4_ = -(uint)(auVar144._12_4_ == iVar123);
                        auVar81._0_4_ = auVar81._4_4_;
                        auVar81._8_4_ = auVar81._12_4_;
                        auVar67 = pshuflw(in_XMM6,auVar81,0xe8);
                        auVar82._0_4_ = auVar82._4_4_;
                        auVar82._8_4_ = auVar82._12_4_;
                        auVar144 = pshuflw(auVar63,auVar82,0xe8);
                        auVar138._8_4_ = 0xffffffff;
                        auVar138._0_8_ = 0xffffffffffffffff;
                        auVar138._12_4_ = 0xffffffff;
                        auVar138 = (auVar144 | auVar67 & auVar63) ^ auVar138;
                        auVar144 = packssdw(auVar138,auVar138);
                        if ((auVar144 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar50[uVar44 * 4 + -0x1c] = sVar26;
                        }
                        auVar82 = auVar81 & auVar111 | auVar82;
                        auVar144 = packssdw(auVar82,auVar82);
                        auVar13._8_4_ = 0xffffffff;
                        auVar13._0_8_ = 0xffffffffffffffff;
                        auVar13._12_4_ = 0xffffffff;
                        auVar144 = packssdw(auVar144 ^ auVar13,auVar144 ^ auVar13);
                        if ((auVar144._0_4_ >> 0x10 & 1) != 0) {
                          psVar50[uVar44 * 4 + -0x18] = sVar26;
                        }
                        auVar144 = (auVar56 | _DAT_00156610) ^ auVar143;
                        iVar132 = -(uint)(iVar27 < auVar144._0_4_);
                        auVar128._4_4_ = -(uint)(iVar30 < auVar144._4_4_);
                        iVar133 = -(uint)(iVar33 < auVar144._8_4_);
                        auVar128._12_4_ = -(uint)(iVar123 < auVar144._12_4_);
                        auVar83._4_4_ = iVar132;
                        auVar83._0_4_ = iVar132;
                        auVar83._8_4_ = iVar133;
                        auVar83._12_4_ = iVar133;
                        auVar112._4_4_ = -(uint)(auVar144._4_4_ == iVar30);
                        auVar112._12_4_ = -(uint)(auVar144._12_4_ == iVar123);
                        auVar112._0_4_ = auVar112._4_4_;
                        auVar112._8_4_ = auVar112._12_4_;
                        auVar128._0_4_ = auVar128._4_4_;
                        auVar128._8_4_ = auVar128._12_4_;
                        auVar144 = auVar112 & auVar83 | auVar128;
                        auVar144 = packssdw(auVar144,auVar144);
                        auVar14._8_4_ = 0xffffffff;
                        auVar14._0_8_ = 0xffffffffffffffff;
                        auVar14._12_4_ = 0xffffffff;
                        auVar144 = packssdw(auVar144 ^ auVar14,auVar144 ^ auVar14);
                        if ((auVar144 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar50[uVar44 * 4 + -0x14] = sVar26;
                        }
                        auVar68 = pshufhw(auVar83,auVar83,0x84);
                        auVar113 = pshufhw(auVar112,auVar112,0x84);
                        auVar104 = pshufhw(auVar68,auVar128,0x84);
                        auVar84._8_4_ = 0xffffffff;
                        auVar84._0_8_ = 0xffffffffffffffff;
                        auVar84._12_4_ = 0xffffffff;
                        auVar84 = (auVar104 | auVar113 & auVar68) ^ auVar84;
                        auVar68 = packssdw(auVar84,auVar84);
                        if ((auVar68 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar50[uVar44 * 4 + -0x10] = sVar26;
                        }
                        auVar68 = (auVar56 | _DAT_00156600) ^ auVar143;
                        iVar132 = -(uint)(iVar27 < auVar68._0_4_);
                        auVar86._4_4_ = -(uint)(iVar30 < auVar68._4_4_);
                        iVar133 = -(uint)(iVar33 < auVar68._8_4_);
                        auVar86._12_4_ = -(uint)(iVar123 < auVar68._12_4_);
                        auVar114._4_4_ = iVar132;
                        auVar114._0_4_ = iVar132;
                        auVar114._8_4_ = iVar133;
                        auVar114._12_4_ = iVar133;
                        auVar144 = pshuflw(auVar144,auVar114,0xe8);
                        auVar85._4_4_ = -(uint)(auVar68._4_4_ == iVar30);
                        auVar85._12_4_ = -(uint)(auVar68._12_4_ == iVar123);
                        auVar85._0_4_ = auVar85._4_4_;
                        auVar85._8_4_ = auVar85._12_4_;
                        in_XMM6 = pshuflw(auVar67 & auVar63,auVar85,0xe8);
                        in_XMM6 = in_XMM6 & auVar144;
                        auVar86._0_4_ = auVar86._4_4_;
                        auVar86._8_4_ = auVar86._12_4_;
                        auVar63 = pshuflw(auVar144,auVar86,0xe8);
                        auVar139._8_4_ = 0xffffffff;
                        auVar139._0_8_ = 0xffffffffffffffff;
                        auVar139._12_4_ = 0xffffffff;
                        auVar139 = (auVar63 | in_XMM6) ^ auVar139;
                        in_XMM5 = packssdw(auVar139,auVar139);
                        if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          psVar50[uVar44 * 4 + -0xc] = sVar26;
                        }
                        auVar86 = auVar85 & auVar114 | auVar86;
                        auVar63 = packssdw(auVar86,auVar86);
                        auVar15._8_4_ = 0xffffffff;
                        auVar15._0_8_ = 0xffffffffffffffff;
                        auVar15._12_4_ = 0xffffffff;
                        auVar63 = packssdw(auVar63 ^ auVar15,auVar63 ^ auVar15);
                        if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          psVar50[uVar44 * 4 + -8] = sVar26;
                        }
                        auVar63 = (auVar56 | _DAT_001565f0) ^ auVar143;
                        auVar115._0_4_ = -(uint)(iVar27 < auVar63._0_4_);
                        auVar115._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                        auVar115._8_4_ = -(uint)(iVar33 < auVar63._8_4_);
                        auVar115._12_4_ = -(uint)(iVar123 < auVar63._12_4_);
                        auVar87._4_4_ = auVar115._0_4_;
                        auVar87._0_4_ = auVar115._0_4_;
                        auVar87._8_4_ = auVar115._8_4_;
                        auVar87._12_4_ = auVar115._8_4_;
                        auVar57._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                        auVar57._12_4_ = -(uint)(auVar63._12_4_ == iVar123);
                        auVar57._0_4_ = auVar57._4_4_;
                        auVar57._8_4_ = auVar57._12_4_;
                        auVar61._4_4_ = auVar115._4_4_;
                        auVar61._0_4_ = auVar115._4_4_;
                        auVar61._8_4_ = auVar115._12_4_;
                        auVar61._12_4_ = auVar115._12_4_;
                        auVar63 = packssdw(auVar115,auVar57 & auVar87 | auVar61);
                        auVar16._8_4_ = 0xffffffff;
                        auVar16._0_8_ = 0xffffffffffffffff;
                        auVar16._12_4_ = 0xffffffff;
                        auVar63 = packssdw(auVar63 ^ auVar16,auVar63 ^ auVar16);
                        if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          psVar50[uVar44 * 4 + -4] = sVar26;
                        }
                        auVar67 = pshufhw(auVar87,auVar87,0x84);
                        auVar63 = pshufhw(auVar57,auVar57,0x84);
                        auVar144 = pshufhw(auVar61,auVar61,0x84);
                        auVar17._8_4_ = 0xffffffff;
                        auVar17._0_8_ = 0xffffffffffffffff;
                        auVar17._12_4_ = 0xffffffff;
                        auVar63 = packssdw(auVar63 & auVar67,
                                           (auVar144 | auVar63 & auVar67) ^ auVar17);
                        if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          psVar50[uVar44 * 4] = sVar26;
                        }
                        uVar44 = uVar44 + 8;
                      } while (((ulong)uVar34 + 7 & 0xfffffffffffffff8) != uVar44);
                    }
                  }
                  else if (0 < (int)uVar42) {
                    cVar25 = -(uVar38 == 3);
                    uVar44 = 0;
                    do {
                      auVar144._8_4_ = (int)uVar44;
                      auVar144._0_8_ = uVar44;
                      auVar144._12_4_ = (int)(uVar44 >> 0x20);
                      auVar63 = auVar59 ^ auVar143;
                      auVar67 = (auVar144 | _DAT_001565b0) ^ auVar143;
                      iVar27 = auVar63._0_4_;
                      iVar132 = -(uint)(iVar27 < auVar67._0_4_);
                      iVar30 = auVar63._4_4_;
                      auVar104._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar33 = auVar63._8_4_;
                      iVar133 = -(uint)(iVar33 < auVar67._8_4_);
                      iVar123 = auVar63._12_4_;
                      auVar104._12_4_ = -(uint)(iVar123 < auVar67._12_4_);
                      auVar113._4_4_ = iVar132;
                      auVar113._0_4_ = iVar132;
                      auVar113._8_4_ = iVar133;
                      auVar113._12_4_ = iVar133;
                      auVar140 = pshuflw(in_XMM5,auVar113,0xe8);
                      auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar123);
                      auVar68._0_4_ = auVar68._4_4_;
                      auVar68._8_4_ = auVar68._12_4_;
                      auVar145 = pshuflw(in_XMM6,auVar68,0xe8);
                      auVar104._0_4_ = auVar104._4_4_;
                      auVar104._8_4_ = auVar104._12_4_;
                      auVar67 = pshuflw(auVar140,auVar104,0xe8);
                      auVar63._8_4_ = 0xffffffff;
                      auVar63._0_8_ = 0xffffffffffffffff;
                      auVar63._12_4_ = 0xffffffff;
                      auVar63 = (auVar67 | auVar145 & auVar140) ^ auVar63;
                      auVar63 = packssdw(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1e) = cVar25;
                      }
                      auVar104 = auVar68 & auVar113 | auVar104;
                      auVar63 = packssdw(auVar104,auVar104);
                      auVar67._8_4_ = 0xffffffff;
                      auVar67._0_8_ = 0xffffffffffffffff;
                      auVar67._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar67,auVar63 ^ auVar67);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1c) = cVar25;
                      }
                      auVar63 = (auVar144 | _DAT_00156610) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar63._0_4_);
                      auVar129._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar63._8_4_);
                      auVar129._12_4_ = -(uint)(iVar123 < auVar63._12_4_);
                      auVar88._4_4_ = iVar132;
                      auVar88._0_4_ = iVar132;
                      auVar88._8_4_ = iVar133;
                      auVar88._12_4_ = iVar133;
                      auVar116._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar116._12_4_ = -(uint)(auVar63._12_4_ == iVar123);
                      auVar116._0_4_ = auVar116._4_4_;
                      auVar116._8_4_ = auVar116._12_4_;
                      auVar129._0_4_ = auVar129._4_4_;
                      auVar129._8_4_ = auVar129._12_4_;
                      auVar63 = auVar116 & auVar88 | auVar129;
                      auVar63 = packssdw(auVar63,auVar63);
                      auVar18._8_4_ = 0xffffffff;
                      auVar18._0_8_ = 0xffffffffffffffff;
                      auVar18._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar18,auVar63 ^ auVar18);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1a) = cVar25;
                      }
                      auVar67 = pshufhw(auVar88,auVar88,0x84);
                      auVar104 = pshufhw(auVar116,auVar116,0x84);
                      auVar68 = pshufhw(auVar67,auVar129,0x84);
                      auVar89._8_4_ = 0xffffffff;
                      auVar89._0_8_ = 0xffffffffffffffff;
                      auVar89._12_4_ = 0xffffffff;
                      auVar89 = (auVar68 | auVar104 & auVar67) ^ auVar89;
                      auVar67 = packssdw(auVar89,auVar89);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x18) = cVar25;
                      }
                      auVar67 = (auVar144 | _DAT_00156600) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar67._0_4_);
                      auVar91._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar67._8_4_);
                      auVar91._12_4_ = -(uint)(iVar123 < auVar67._12_4_);
                      auVar117._4_4_ = iVar132;
                      auVar117._0_4_ = iVar132;
                      auVar117._8_4_ = iVar133;
                      auVar117._12_4_ = iVar133;
                      auVar63 = pshuflw(auVar63,auVar117,0xe8);
                      auVar90._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar90._12_4_ = -(uint)(auVar67._12_4_ == iVar123);
                      auVar90._0_4_ = auVar90._4_4_;
                      auVar90._8_4_ = auVar90._12_4_;
                      auVar68 = pshuflw(auVar145 & auVar140,auVar90,0xe8);
                      auVar91._0_4_ = auVar91._4_4_;
                      auVar91._8_4_ = auVar91._12_4_;
                      auVar67 = pshuflw(auVar63,auVar91,0xe8);
                      auVar140._8_4_ = 0xffffffff;
                      auVar140._0_8_ = 0xffffffffffffffff;
                      auVar140._12_4_ = 0xffffffff;
                      auVar140 = (auVar67 | auVar68 & auVar63) ^ auVar140;
                      auVar67 = packssdw(auVar140,auVar140);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x16) = cVar25;
                      }
                      auVar91 = auVar90 & auVar117 | auVar91;
                      auVar67 = packssdw(auVar91,auVar91);
                      auVar145._8_4_ = 0xffffffff;
                      auVar145._0_8_ = 0xffffffffffffffff;
                      auVar145._12_4_ = 0xffffffff;
                      auVar67 = packssdw(auVar67 ^ auVar145,auVar67 ^ auVar145);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x14) = cVar25;
                      }
                      auVar67 = (auVar144 | _DAT_001565f0) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar67._0_4_);
                      auVar130._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar67._8_4_);
                      auVar130._12_4_ = -(uint)(iVar123 < auVar67._12_4_);
                      auVar92._4_4_ = iVar132;
                      auVar92._0_4_ = iVar132;
                      auVar92._8_4_ = iVar133;
                      auVar92._12_4_ = iVar133;
                      auVar118._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar118._12_4_ = -(uint)(auVar67._12_4_ == iVar123);
                      auVar118._0_4_ = auVar118._4_4_;
                      auVar118._8_4_ = auVar118._12_4_;
                      auVar130._0_4_ = auVar130._4_4_;
                      auVar130._8_4_ = auVar130._12_4_;
                      auVar67 = auVar118 & auVar92 | auVar130;
                      auVar67 = packssdw(auVar67,auVar67);
                      auVar19._8_4_ = 0xffffffff;
                      auVar19._0_8_ = 0xffffffffffffffff;
                      auVar19._12_4_ = 0xffffffff;
                      auVar67 = packssdw(auVar67 ^ auVar19,auVar67 ^ auVar19);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x12) = cVar25;
                      }
                      auVar104 = pshufhw(auVar92,auVar92,0x84);
                      auVar140 = pshufhw(auVar118,auVar118,0x84);
                      auVar113 = pshufhw(auVar104,auVar130,0x84);
                      auVar93._8_4_ = 0xffffffff;
                      auVar93._0_8_ = 0xffffffffffffffff;
                      auVar93._12_4_ = 0xffffffff;
                      auVar93 = (auVar113 | auVar140 & auVar104) ^ auVar93;
                      auVar104 = packssdw(auVar93,auVar93);
                      auVar104 = packsswb(auVar104,auVar104);
                      if ((auVar104._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x10) = cVar25;
                      }
                      auVar104 = (auVar144 | _DAT_00157a20) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar104._0_4_);
                      auVar95._4_4_ = -(uint)(iVar30 < auVar104._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar104._8_4_);
                      auVar95._12_4_ = -(uint)(iVar123 < auVar104._12_4_);
                      auVar119._4_4_ = iVar132;
                      auVar119._0_4_ = iVar132;
                      auVar119._8_4_ = iVar133;
                      auVar119._12_4_ = iVar133;
                      auVar67 = pshuflw(auVar67,auVar119,0xe8);
                      auVar94._4_4_ = -(uint)(auVar104._4_4_ == iVar30);
                      auVar94._12_4_ = -(uint)(auVar104._12_4_ == iVar123);
                      auVar94._0_4_ = auVar94._4_4_;
                      auVar94._8_4_ = auVar94._12_4_;
                      auVar68 = pshuflw(auVar68 & auVar63,auVar94,0xe8);
                      auVar95._0_4_ = auVar95._4_4_;
                      auVar95._8_4_ = auVar95._12_4_;
                      auVar63 = pshuflw(auVar67,auVar95,0xe8);
                      auVar141._8_4_ = 0xffffffff;
                      auVar141._0_8_ = 0xffffffffffffffff;
                      auVar141._12_4_ = 0xffffffff;
                      auVar141 = (auVar63 | auVar68 & auVar67) ^ auVar141;
                      auVar63 = packssdw(auVar141,auVar141);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0xe) = cVar25;
                      }
                      auVar95 = auVar94 & auVar119 | auVar95;
                      auVar63 = packssdw(auVar95,auVar95);
                      auVar20._8_4_ = 0xffffffff;
                      auVar20._0_8_ = 0xffffffffffffffff;
                      auVar20._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar20,auVar63 ^ auVar20);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0xc) = cVar25;
                      }
                      auVar63 = (auVar144 | _DAT_00157a10) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar63._0_4_);
                      auVar131._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar63._8_4_);
                      auVar131._12_4_ = -(uint)(iVar123 < auVar63._12_4_);
                      auVar96._4_4_ = iVar132;
                      auVar96._0_4_ = iVar132;
                      auVar96._8_4_ = iVar133;
                      auVar96._12_4_ = iVar133;
                      auVar120._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar120._12_4_ = -(uint)(auVar63._12_4_ == iVar123);
                      auVar120._0_4_ = auVar120._4_4_;
                      auVar120._8_4_ = auVar120._12_4_;
                      auVar131._0_4_ = auVar131._4_4_;
                      auVar131._8_4_ = auVar131._12_4_;
                      auVar63 = auVar120 & auVar96 | auVar131;
                      auVar63 = packssdw(auVar63,auVar63);
                      auVar21._8_4_ = 0xffffffff;
                      auVar21._0_8_ = 0xffffffffffffffff;
                      auVar21._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar21,auVar63 ^ auVar21);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -10) = cVar25;
                      }
                      auVar104 = pshufhw(auVar96,auVar96,0x84);
                      auVar140 = pshufhw(auVar120,auVar120,0x84);
                      auVar113 = pshufhw(auVar104,auVar131,0x84);
                      auVar97._8_4_ = 0xffffffff;
                      auVar97._0_8_ = 0xffffffffffffffff;
                      auVar97._12_4_ = 0xffffffff;
                      auVar97 = (auVar113 | auVar140 & auVar104) ^ auVar97;
                      auVar104 = packssdw(auVar97,auVar97);
                      auVar104 = packsswb(auVar104,auVar104);
                      if ((auVar104._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -8) = cVar25;
                      }
                      auVar104 = (auVar144 | _DAT_00157a00) ^ auVar143;
                      iVar132 = -(uint)(iVar27 < auVar104._0_4_);
                      auVar99._4_4_ = -(uint)(iVar30 < auVar104._4_4_);
                      iVar133 = -(uint)(iVar33 < auVar104._8_4_);
                      auVar99._12_4_ = -(uint)(iVar123 < auVar104._12_4_);
                      auVar121._4_4_ = iVar132;
                      auVar121._0_4_ = iVar132;
                      auVar121._8_4_ = iVar133;
                      auVar121._12_4_ = iVar133;
                      auVar63 = pshuflw(auVar63,auVar121,0xe8);
                      auVar98._4_4_ = -(uint)(auVar104._4_4_ == iVar30);
                      auVar98._12_4_ = -(uint)(auVar104._12_4_ == iVar123);
                      auVar98._0_4_ = auVar98._4_4_;
                      auVar98._8_4_ = auVar98._12_4_;
                      in_XMM6 = pshuflw(auVar68 & auVar67,auVar98,0xe8);
                      in_XMM6 = in_XMM6 & auVar63;
                      auVar99._0_4_ = auVar99._4_4_;
                      auVar99._8_4_ = auVar99._12_4_;
                      auVar63 = pshuflw(auVar63,auVar99,0xe8);
                      auVar142._8_4_ = 0xffffffff;
                      auVar142._0_8_ = 0xffffffffffffffff;
                      auVar142._12_4_ = 0xffffffff;
                      auVar142 = (auVar63 | in_XMM6) ^ auVar142;
                      auVar63 = packssdw(auVar142,auVar142);
                      in_XMM5 = packsswb(auVar63,auVar63);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -6) = cVar25;
                      }
                      auVar99 = auVar98 & auVar121 | auVar99;
                      auVar63 = packssdw(auVar99,auVar99);
                      auVar22._8_4_ = 0xffffffff;
                      auVar22._0_8_ = 0xffffffffffffffff;
                      auVar22._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar22,auVar63 ^ auVar22);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -4) = cVar25;
                      }
                      auVar63 = (auVar144 | _DAT_001579f0) ^ auVar143;
                      auVar122._0_4_ = -(uint)(iVar27 < auVar63._0_4_);
                      auVar122._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      auVar122._8_4_ = -(uint)(iVar33 < auVar63._8_4_);
                      auVar122._12_4_ = -(uint)(iVar123 < auVar63._12_4_);
                      auVar100._4_4_ = auVar122._0_4_;
                      auVar100._0_4_ = auVar122._0_4_;
                      auVar100._8_4_ = auVar122._8_4_;
                      auVar100._12_4_ = auVar122._8_4_;
                      auVar58._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar58._12_4_ = -(uint)(auVar63._12_4_ == iVar123);
                      auVar58._0_4_ = auVar58._4_4_;
                      auVar58._8_4_ = auVar58._12_4_;
                      auVar62._4_4_ = auVar122._4_4_;
                      auVar62._0_4_ = auVar122._4_4_;
                      auVar62._8_4_ = auVar122._12_4_;
                      auVar62._12_4_ = auVar122._12_4_;
                      auVar63 = packssdw(auVar122,auVar58 & auVar100 | auVar62);
                      auVar23._8_4_ = 0xffffffff;
                      auVar23._0_8_ = 0xffffffffffffffff;
                      auVar23._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar23,auVar63 ^ auVar23);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -2) = cVar25;
                      }
                      auVar67 = pshufhw(auVar100,auVar100,0x84);
                      auVar63 = pshufhw(auVar58,auVar58,0x84);
                      auVar144 = pshufhw(auVar62,auVar62,0x84);
                      auVar24._8_4_ = 0xffffffff;
                      auVar24._0_8_ = 0xffffffffffffffff;
                      auVar24._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 & auVar67,(auVar144 | auVar63 & auVar67) ^ auVar24)
                      ;
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2) = cVar25;
                      }
                      uVar44 = uVar44 + 0x10;
                    } while (((ulong)uVar34 + 0xf & 0xfffffffffffffff0) != uVar44);
                  }
                  uVar38 = uVar38 + 1;
                  psVar47 = (stbi__uint16 *)((long)psVar47 + 1);
                  psVar50 = psVar50 + 1;
                  psVar48 = (stbi__uint16 *)((long)psVar48 + 1);
                  local_68 = local_68 + 1;
                } while (uVar38 != 4);
              }
              else {
                stbi__skip(s,uVar28 * y_00 * 2);
                psVar35 = s->buffer_start;
                psVar1 = s->buffer_start + 1;
                lVar43 = (ulong)((uVar29 | uVar40) * (uVar31 | uVar41)) - 1;
                auVar53._8_4_ = (int)lVar43;
                auVar53._0_8_ = lVar43;
                auVar53._12_4_ = (int)((ulong)lVar43 >> 0x20);
                psVar47 = data + 0x1e;
                uVar38 = 0;
                auVar143 = _DAT_00153050;
                do {
                  if (uVar38 < uVar28) {
                    if (0 < (int)uVar42) {
                      pbVar49 = (byte *)((long)data + uVar38);
                      iVar27 = 0;
                      uVar34 = uVar42;
                      do {
                        pbVar3 = s->img_buffer;
                        psVar37 = s->img_buffer_end;
                        if (pbVar3 < psVar37) {
                          s->img_buffer = pbVar3 + 1;
                          bVar45 = *pbVar3;
                          psVar39 = pbVar3 + 1;
LAB_00146da3:
                          if (bVar45 != 0x80) {
                            uVar51 = (uint)bVar45;
                            if ((char)bVar45 < '\0') {
                              uVar52 = 0x101 - uVar51;
                              if (uVar52 <= uVar34) {
                                if (psVar39 < psVar37) {
                                  s->img_buffer = psVar39 + 1;
                                  bVar45 = *psVar39;
                                }
                                else if (s->read_from_callbacks == 0) {
                                  bVar45 = 0;
                                }
                                else {
                                  iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen
                                                          );
                                  if (iVar30 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->buffer_start[0] = '\0';
                                    bVar45 = 0;
                                    psVar37 = psVar1;
                                  }
                                  else {
                                    bVar45 = *psVar35;
                                    psVar37 = psVar35 + iVar30;
                                  }
                                  auVar143 = _DAT_00153050;
                                  s->img_buffer_end = psVar37;
                                  s->img_buffer = psVar1;
                                }
                                iVar30 = uVar51 - 0x101;
                                do {
                                  *pbVar49 = bVar45;
                                  pbVar49 = pbVar49 + 4;
                                  iVar30 = iVar30 + 1;
                                } while (iVar30 != 0);
                                goto LAB_00146f16;
                              }
                            }
                            else if (bVar45 < uVar34) goto LAB_00146dc6;
                            free(data);
                            pcVar36 = "corrupt";
                            goto LAB_00146b59;
                          }
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                            if (iVar30 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar45 = 0;
                              psVar37 = psVar1;
                            }
                            else {
                              bVar45 = *psVar35;
                              psVar37 = psVar35 + iVar30;
                            }
                            s->img_buffer_end = psVar37;
                            s->img_buffer = psVar1;
                            psVar39 = psVar1;
                            auVar143 = _DAT_00153050;
                            goto LAB_00146da3;
                          }
                          uVar51 = 0;
LAB_00146dc6:
                          uVar52 = uVar51 + 1;
                          uVar34 = uVar52;
                          do {
                            pbVar3 = s->img_buffer;
                            if (pbVar3 < s->img_buffer_end) {
                              s->img_buffer = pbVar3 + 1;
                              bVar45 = *pbVar3;
                            }
                            else if (s->read_from_callbacks == 0) {
                              bVar45 = 0;
                            }
                            else {
                              iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar35,s->buflen);
                              if (iVar30 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                bVar45 = 0;
                                psVar37 = psVar1;
                              }
                              else {
                                bVar45 = *psVar35;
                                psVar37 = psVar35 + iVar30;
                              }
                              auVar143 = _DAT_00153050;
                              s->img_buffer_end = psVar37;
                              s->img_buffer = psVar1;
                            }
                            *pbVar49 = bVar45;
                            pbVar49 = pbVar49 + 4;
                            uVar34 = uVar34 - 1;
                          } while (uVar34 != 0);
LAB_00146f16:
                          iVar27 = iVar27 + uVar52;
                        }
                        uVar34 = uVar42 - iVar27;
                      } while (uVar34 != 0 && iVar27 <= (int)uVar42);
                    }
                  }
                  else if (0 < (int)uVar42) {
                    cVar25 = -(uVar38 == 3);
                    uVar44 = 0;
                    do {
                      auVar54._8_4_ = (int)uVar44;
                      auVar54._0_8_ = uVar44;
                      auVar54._12_4_ = (int)(uVar44 >> 0x20);
                      auVar59 = auVar53 ^ auVar143;
                      auVar63 = (auVar54 | _DAT_001565b0) ^ auVar143;
                      iVar27 = auVar59._0_4_;
                      iVar123 = -(uint)(iVar27 < auVar63._0_4_);
                      iVar30 = auVar59._4_4_;
                      auVar65._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      iVar32 = auVar59._8_4_;
                      iVar132 = -(uint)(iVar32 < auVar63._8_4_);
                      iVar33 = auVar59._12_4_;
                      auVar65._12_4_ = -(uint)(iVar33 < auVar63._12_4_);
                      auVar102._4_4_ = iVar123;
                      auVar102._0_4_ = iVar123;
                      auVar102._8_4_ = iVar132;
                      auVar102._12_4_ = iVar132;
                      auVar59 = pshuflw(in_XMM5,auVar102,0xe8);
                      auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar33);
                      auVar64._0_4_ = auVar64._4_4_;
                      auVar64._8_4_ = auVar64._12_4_;
                      auVar144 = pshuflw(in_XMM6,auVar64,0xe8);
                      auVar65._0_4_ = auVar65._4_4_;
                      auVar65._8_4_ = auVar65._12_4_;
                      auVar63 = pshuflw(auVar59,auVar65,0xe8);
                      auVar134._8_4_ = 0xffffffff;
                      auVar134._0_8_ = 0xffffffffffffffff;
                      auVar134._12_4_ = 0xffffffff;
                      auVar134 = (auVar63 | auVar144 & auVar59) ^ auVar134;
                      auVar63 = packssdw(auVar134,auVar134);
                      if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1e) = cVar25;
                      }
                      auVar65 = auVar64 & auVar102 | auVar65;
                      auVar63 = packssdw(auVar65,auVar65);
                      auVar4._8_4_ = 0xffffffff;
                      auVar4._0_8_ = 0xffffffffffffffff;
                      auVar4._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar4,auVar63 ^ auVar4);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._0_4_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1c) = cVar25;
                      }
                      auVar63 = (auVar54 | _DAT_00156610) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar63._0_4_);
                      auVar125._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar63._8_4_);
                      auVar125._12_4_ = -(uint)(iVar33 < auVar63._12_4_);
                      auVar66._4_4_ = iVar123;
                      auVar66._0_4_ = iVar123;
                      auVar66._8_4_ = iVar132;
                      auVar66._12_4_ = iVar132;
                      auVar103._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar103._12_4_ = -(uint)(auVar63._12_4_ == iVar33);
                      auVar103._0_4_ = auVar103._4_4_;
                      auVar103._8_4_ = auVar103._12_4_;
                      auVar125._0_4_ = auVar125._4_4_;
                      auVar125._8_4_ = auVar125._12_4_;
                      auVar63 = auVar103 & auVar66 | auVar125;
                      auVar63 = packssdw(auVar63,auVar63);
                      auVar5._8_4_ = 0xffffffff;
                      auVar5._0_8_ = 0xffffffffffffffff;
                      auVar5._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar5,auVar63 ^ auVar5);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x1a) = cVar25;
                      }
                      auVar67 = pshufhw(auVar66,auVar66,0x84);
                      auVar104 = pshufhw(auVar103,auVar103,0x84);
                      auVar68 = pshufhw(auVar67,auVar125,0x84);
                      auVar69._8_4_ = 0xffffffff;
                      auVar69._0_8_ = 0xffffffffffffffff;
                      auVar69._12_4_ = 0xffffffff;
                      auVar69 = (auVar68 | auVar104 & auVar67) ^ auVar69;
                      auVar67 = packssdw(auVar69,auVar69);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67._0_4_ >> 0x18 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x18) = cVar25;
                      }
                      auVar67 = (auVar54 | _DAT_00156600) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar67._0_4_);
                      auVar71._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar67._8_4_);
                      auVar71._12_4_ = -(uint)(iVar33 < auVar67._12_4_);
                      auVar105._4_4_ = iVar123;
                      auVar105._0_4_ = iVar123;
                      auVar105._8_4_ = iVar132;
                      auVar105._12_4_ = iVar132;
                      auVar63 = pshuflw(auVar63,auVar105,0xe8);
                      auVar70._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar70._12_4_ = -(uint)(auVar67._12_4_ == iVar33);
                      auVar70._0_4_ = auVar70._4_4_;
                      auVar70._8_4_ = auVar70._12_4_;
                      auVar144 = pshuflw(auVar144 & auVar59,auVar70,0xe8);
                      auVar71._0_4_ = auVar71._4_4_;
                      auVar71._8_4_ = auVar71._12_4_;
                      auVar59 = pshuflw(auVar63,auVar71,0xe8);
                      auVar135._8_4_ = 0xffffffff;
                      auVar135._0_8_ = 0xffffffffffffffff;
                      auVar135._12_4_ = 0xffffffff;
                      auVar135 = (auVar59 | auVar144 & auVar63) ^ auVar135;
                      auVar59 = packssdw(auVar135,auVar135);
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x16) = cVar25;
                      }
                      auVar71 = auVar70 & auVar105 | auVar71;
                      auVar59 = packssdw(auVar71,auVar71);
                      auVar6._8_4_ = 0xffffffff;
                      auVar6._0_8_ = 0xffffffffffffffff;
                      auVar6._12_4_ = 0xffffffff;
                      auVar59 = packssdw(auVar59 ^ auVar6,auVar59 ^ auVar6);
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59._4_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x14) = cVar25;
                      }
                      auVar59 = (auVar54 | _DAT_001565f0) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar59._0_4_);
                      auVar126._4_4_ = -(uint)(iVar30 < auVar59._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar59._8_4_);
                      auVar126._12_4_ = -(uint)(iVar33 < auVar59._12_4_);
                      auVar72._4_4_ = iVar123;
                      auVar72._0_4_ = iVar123;
                      auVar72._8_4_ = iVar132;
                      auVar72._12_4_ = iVar132;
                      auVar106._4_4_ = -(uint)(auVar59._4_4_ == iVar30);
                      auVar106._12_4_ = -(uint)(auVar59._12_4_ == iVar33);
                      auVar106._0_4_ = auVar106._4_4_;
                      auVar106._8_4_ = auVar106._12_4_;
                      auVar126._0_4_ = auVar126._4_4_;
                      auVar126._8_4_ = auVar126._12_4_;
                      auVar59 = auVar106 & auVar72 | auVar126;
                      auVar59 = packssdw(auVar59,auVar59);
                      auVar7._8_4_ = 0xffffffff;
                      auVar7._0_8_ = 0xffffffffffffffff;
                      auVar7._12_4_ = 0xffffffff;
                      auVar59 = packssdw(auVar59 ^ auVar7,auVar59 ^ auVar7);
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x12) = cVar25;
                      }
                      auVar67 = pshufhw(auVar72,auVar72,0x84);
                      auVar104 = pshufhw(auVar106,auVar106,0x84);
                      auVar68 = pshufhw(auVar67,auVar126,0x84);
                      auVar73._8_4_ = 0xffffffff;
                      auVar73._0_8_ = 0xffffffffffffffff;
                      auVar73._12_4_ = 0xffffffff;
                      auVar73 = (auVar68 | auVar104 & auVar67) ^ auVar73;
                      auVar67 = packssdw(auVar73,auVar73);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67._6_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0x10) = cVar25;
                      }
                      auVar67 = (auVar54 | _DAT_00157a20) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar67._0_4_);
                      auVar75._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar67._8_4_);
                      auVar75._12_4_ = -(uint)(iVar33 < auVar67._12_4_);
                      auVar107._4_4_ = iVar123;
                      auVar107._0_4_ = iVar123;
                      auVar107._8_4_ = iVar132;
                      auVar107._12_4_ = iVar132;
                      auVar59 = pshuflw(auVar59,auVar107,0xe8);
                      auVar74._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar74._12_4_ = -(uint)(auVar67._12_4_ == iVar33);
                      auVar74._0_4_ = auVar74._4_4_;
                      auVar74._8_4_ = auVar74._12_4_;
                      auVar144 = pshuflw(auVar144 & auVar63,auVar74,0xe8);
                      auVar75._0_4_ = auVar75._4_4_;
                      auVar75._8_4_ = auVar75._12_4_;
                      auVar63 = pshuflw(auVar59,auVar75,0xe8);
                      auVar136._8_4_ = 0xffffffff;
                      auVar136._0_8_ = 0xffffffffffffffff;
                      auVar136._12_4_ = 0xffffffff;
                      auVar136 = (auVar63 | auVar144 & auVar59) ^ auVar136;
                      auVar63 = packssdw(auVar136,auVar136);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0xe) = cVar25;
                      }
                      auVar75 = auVar74 & auVar107 | auVar75;
                      auVar63 = packssdw(auVar75,auVar75);
                      auVar8._8_4_ = 0xffffffff;
                      auVar8._0_8_ = 0xffffffffffffffff;
                      auVar8._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar8,auVar63 ^ auVar8);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63._8_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -0xc) = cVar25;
                      }
                      auVar63 = (auVar54 | _DAT_00157a10) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar63._0_4_);
                      auVar127._4_4_ = -(uint)(iVar30 < auVar63._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar63._8_4_);
                      auVar127._12_4_ = -(uint)(iVar33 < auVar63._12_4_);
                      auVar76._4_4_ = iVar123;
                      auVar76._0_4_ = iVar123;
                      auVar76._8_4_ = iVar132;
                      auVar76._12_4_ = iVar132;
                      auVar108._4_4_ = -(uint)(auVar63._4_4_ == iVar30);
                      auVar108._12_4_ = -(uint)(auVar63._12_4_ == iVar33);
                      auVar108._0_4_ = auVar108._4_4_;
                      auVar108._8_4_ = auVar108._12_4_;
                      auVar127._0_4_ = auVar127._4_4_;
                      auVar127._8_4_ = auVar127._12_4_;
                      auVar63 = auVar108 & auVar76 | auVar127;
                      auVar63 = packssdw(auVar63,auVar63);
                      auVar9._8_4_ = 0xffffffff;
                      auVar9._0_8_ = 0xffffffffffffffff;
                      auVar9._12_4_ = 0xffffffff;
                      auVar63 = packssdw(auVar63 ^ auVar9,auVar63 ^ auVar9);
                      auVar63 = packsswb(auVar63,auVar63);
                      if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -10) = cVar25;
                      }
                      auVar67 = pshufhw(auVar76,auVar76,0x84);
                      auVar104 = pshufhw(auVar108,auVar108,0x84);
                      auVar68 = pshufhw(auVar67,auVar127,0x84);
                      auVar77._8_4_ = 0xffffffff;
                      auVar77._0_8_ = 0xffffffffffffffff;
                      auVar77._12_4_ = 0xffffffff;
                      auVar77 = (auVar68 | auVar104 & auVar67) ^ auVar77;
                      auVar67 = packssdw(auVar77,auVar77);
                      auVar67 = packsswb(auVar67,auVar67);
                      if ((auVar67._10_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -8) = cVar25;
                      }
                      auVar67 = (auVar54 | _DAT_00157a00) ^ auVar143;
                      iVar123 = -(uint)(iVar27 < auVar67._0_4_);
                      auVar79._4_4_ = -(uint)(iVar30 < auVar67._4_4_);
                      iVar132 = -(uint)(iVar32 < auVar67._8_4_);
                      auVar79._12_4_ = -(uint)(iVar33 < auVar67._12_4_);
                      auVar109._4_4_ = iVar123;
                      auVar109._0_4_ = iVar123;
                      auVar109._8_4_ = iVar132;
                      auVar109._12_4_ = iVar132;
                      auVar63 = pshuflw(auVar63,auVar109,0xe8);
                      auVar78._4_4_ = -(uint)(auVar67._4_4_ == iVar30);
                      auVar78._12_4_ = -(uint)(auVar67._12_4_ == iVar33);
                      auVar78._0_4_ = auVar78._4_4_;
                      auVar78._8_4_ = auVar78._12_4_;
                      in_XMM6 = pshuflw(auVar144 & auVar59,auVar78,0xe8);
                      in_XMM6 = in_XMM6 & auVar63;
                      auVar79._0_4_ = auVar79._4_4_;
                      auVar79._8_4_ = auVar79._12_4_;
                      auVar59 = pshuflw(auVar63,auVar79,0xe8);
                      auVar137._8_4_ = 0xffffffff;
                      auVar137._0_8_ = 0xffffffffffffffff;
                      auVar137._12_4_ = 0xffffffff;
                      auVar137 = (auVar59 | in_XMM6) ^ auVar137;
                      auVar59 = packssdw(auVar137,auVar137);
                      in_XMM5 = packsswb(auVar59,auVar59);
                      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -6) = cVar25;
                      }
                      auVar79 = auVar78 & auVar109 | auVar79;
                      auVar59 = packssdw(auVar79,auVar79);
                      auVar10._8_4_ = 0xffffffff;
                      auVar10._0_8_ = 0xffffffffffffffff;
                      auVar10._12_4_ = 0xffffffff;
                      auVar59 = packssdw(auVar59 ^ auVar10,auVar59 ^ auVar10);
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59._12_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2 + -4) = cVar25;
                      }
                      auVar59 = (auVar54 | _DAT_001579f0) ^ auVar143;
                      auVar110._0_4_ = -(uint)(iVar27 < auVar59._0_4_);
                      auVar110._4_4_ = -(uint)(iVar30 < auVar59._4_4_);
                      auVar110._8_4_ = -(uint)(iVar32 < auVar59._8_4_);
                      auVar110._12_4_ = -(uint)(iVar33 < auVar59._12_4_);
                      auVar80._4_4_ = auVar110._0_4_;
                      auVar80._0_4_ = auVar110._0_4_;
                      auVar80._8_4_ = auVar110._8_4_;
                      auVar80._12_4_ = auVar110._8_4_;
                      auVar55._4_4_ = -(uint)(auVar59._4_4_ == iVar30);
                      auVar55._12_4_ = -(uint)(auVar59._12_4_ == iVar33);
                      auVar55._0_4_ = auVar55._4_4_;
                      auVar55._8_4_ = auVar55._12_4_;
                      auVar60._4_4_ = auVar110._4_4_;
                      auVar60._0_4_ = auVar110._4_4_;
                      auVar60._8_4_ = auVar110._12_4_;
                      auVar60._12_4_ = auVar110._12_4_;
                      auVar59 = packssdw(auVar110,auVar55 & auVar80 | auVar60);
                      auVar11._8_4_ = 0xffffffff;
                      auVar11._0_8_ = 0xffffffffffffffff;
                      auVar11._12_4_ = 0xffffffff;
                      auVar59 = packssdw(auVar59 ^ auVar11,auVar59 ^ auVar11);
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(char *)(psVar47 + uVar44 * 2 + -2) = cVar25;
                      }
                      auVar144 = pshufhw(auVar80,auVar80,0x84);
                      auVar59 = pshufhw(auVar55,auVar55,0x84);
                      auVar63 = pshufhw(auVar60,auVar60,0x84);
                      auVar12._8_4_ = 0xffffffff;
                      auVar12._0_8_ = 0xffffffffffffffff;
                      auVar12._12_4_ = 0xffffffff;
                      auVar59 = packssdw(auVar59 & auVar144,(auVar63 | auVar59 & auVar144) ^ auVar12
                                        );
                      auVar59 = packsswb(auVar59,auVar59);
                      if ((auVar59._14_2_ >> 8 & 1) != 0) {
                        *(char *)(psVar47 + uVar44 * 2) = cVar25;
                      }
                      uVar44 = uVar44 + 0x10;
                    } while (((ulong)((uVar29 + uVar40) * (uVar31 + uVar41)) + 0xf &
                             0xfffffffffffffff0) != uVar44);
                  }
                  uVar38 = uVar38 + 1;
                  psVar47 = (stbi__uint16 *)((long)psVar47 + 1);
                } while (uVar38 != 4);
              }
              if (3 < uVar28) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar42) {
                    uVar38 = 0;
                    do {
                      uVar2 = data[uVar38 * 4 + 3];
                      if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                        fVar124 = 1.0 / ((float)uVar2 / 65535.0);
                        fVar101 = (1.0 - fVar124) * 65535.0;
                        auVar143._0_4_ =
                             (int)(fVar101 +
                                  fVar124 * (float)(*(uint *)(data + uVar38 * 4) & 0xffff));
                        auVar143._4_4_ =
                             (int)(fVar101 + fVar124 * (float)(*(uint *)(data + uVar38 * 4) >> 0x10)
                                  );
                        auVar143._8_4_ = (int)(fVar101 + fVar124 * 0.0);
                        auVar143._12_4_ = (int)(fVar101 + fVar124 * 0.0);
                        auVar143 = pshuflw(auVar143,auVar143,0xe8);
                        *(int *)(data + uVar38 * 4) = auVar143._0_4_;
                        data[uVar38 * 4 + 2] =
                             (stbi__uint16)(int)((float)data[uVar38 * 4 + 2] * fVar124 + fVar101);
                      }
                      uVar38 = uVar38 + 1;
                    } while ((uVar29 + uVar40) * (uVar31 + uVar41) != uVar38);
                  }
                }
                else if (0 < (int)uVar42) {
                  uVar38 = 0;
                  do {
                    bVar45 = *(byte *)((long)data + uVar38 * 4 + 3);
                    if ((bVar45 != 0) && (bVar45 != 0xff)) {
                      fVar124 = 1.0 / ((float)bVar45 / 255.0);
                      fVar101 = (1.0 - fVar124) * 255.0;
                      *(char *)(data + uVar38 * 2) =
                           (char)(int)((float)(byte)data[uVar38 * 2] * fVar124 + fVar101);
                      *(char *)((long)data + uVar38 * 4 + 1) =
                           (char)(int)((float)*(byte *)((long)data + uVar38 * 4 + 1) * fVar124 +
                                      fVar101);
                      *(char *)(data + uVar38 * 2 + 1) =
                           (char)(int)((float)(byte)data[uVar38 * 2 + 1] * fVar124 + fVar101);
                    }
                    uVar38 = uVar38 + 1;
                  } while ((uVar29 + uVar40) * (uVar31 + uVar41) != uVar38);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
            pcVar36 = "outofmem";
          }
        }
        else {
          pcVar36 = "bad compression";
        }
      }
      else {
        pcVar36 = "wrong color format";
      }
    }
    else {
      pcVar36 = "unsupported bit depth";
    }
  }
  else {
    pcVar36 = "wrong channel count";
  }
LAB_00146b59:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar36;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}